

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

int BrotliSetDepth(int p0,HuffmanTree *pool,uint8_t *depth,int max_depth)

{
  bool bVar1;
  int local_70;
  int local_6c;
  int p;
  int level;
  int stack [16];
  int max_depth_local;
  uint8_t *depth_local;
  HuffmanTree *pool_local;
  int p0_local;
  
  local_6c = 0;
  p = -1;
  local_70 = p0;
  stack[0xf] = max_depth;
  while( true ) {
    while (-1 < pool[local_70].index_left_) {
      local_6c = local_6c + 1;
      if (stack[0xf] < local_6c) {
        return 0;
      }
      (&p)[local_6c] = (int)pool[local_70].index_right_or_value_;
      local_70 = (int)pool[local_70].index_left_;
    }
    depth[pool[local_70].index_right_or_value_] = (uint8_t)local_6c;
    while( true ) {
      bVar1 = false;
      if (-1 < local_6c) {
        bVar1 = (&p)[local_6c] == -1;
      }
      if (!bVar1) break;
      local_6c = local_6c + -1;
    }
    if (local_6c < 0) break;
    local_70 = (&p)[local_6c];
    (&p)[local_6c] = -1;
  }
  return 1;
}

Assistant:

BROTLI_BOOL BrotliSetDepth(
    int p0, HuffmanTree* pool, uint8_t* depth, int max_depth) {
  int stack[16];
  int level = 0;
  int p = p0;
  BROTLI_DCHECK(max_depth <= 15);
  stack[0] = -1;
  while (BROTLI_TRUE) {
    if (pool[p].index_left_ >= 0) {
      level++;
      if (level > max_depth) return BROTLI_FALSE;
      stack[level] = pool[p].index_right_or_value_;
      p = pool[p].index_left_;
      continue;
    } else {
      depth[pool[p].index_right_or_value_] = (uint8_t)level;
    }
    while (level >= 0 && stack[level] == -1) level--;
    if (level < 0) return BROTLI_TRUE;
    p = stack[level];
    stack[level] = -1;
  }
}